

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase389::run(TestCase389 *this)

{
  undefined8 uVar1;
  uchar *puVar2;
  char *pcVar3;
  undefined1 in_R8B;
  size_t sVar4;
  char8_t (*pacVar5) [5];
  ArrayPtr<const_unsigned_char> bytes_00;
  ArrayPtr<const_char> text;
  ArrayPtr<const_char> text_00;
  ArrayPtr<const_char> text_01;
  ArrayPtr<const_char> text_02;
  ArrayPtr<const_char> text_03;
  ArrayPtr<const_char> text_04;
  ArrayPtr<const_char> text_05;
  ArrayPtr<const_char> text_06;
  ArrayPtr<const_char> text_07;
  ArrayPtr<const_char> expected;
  ArrayPtr<const_char> text_08;
  ArrayPtr<const_char> text_09;
  ArrayPtr<const_char> expected_00;
  ArrayPtr<const_char> text_10;
  ArrayPtr<const_char> text_11;
  DebugComparison<kj::String,_const_char_(&)[55]> _kjCondition;
  byte bytes [12];
  undefined1 local_248 [48];
  bool local_218;
  String local_208;
  DebugExpression<kj::String> local_1e8;
  EncodingResult<kj::String> local_1c8;
  EncodingResult<kj::String> local_1a8;
  EncodingResult<kj::String> local_188;
  EncodingResult<kj::String> local_168;
  EncodingResult<kj::String> local_148;
  EncodingResult<kj::String> local_128;
  EncodingResult<kj::String> local_108;
  EncodingResult<kj::String> local_e8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  ArrayDisposer *local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ArrayDisposer *local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  ArrayDisposer *local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  ArrayDisposer *local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  ArrayDisposer *local_38;
  undefined8 local_20;
  undefined4 local_18;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  uchar *extraout_RDX_01;
  
  kj::_::encodeCEscapeImpl
            (&local_208,(_ *)anon_var_dwarf_3b0de3,(ArrayPtr<const_unsigned_char>)ZEXT816(0x2c),
             (bool)in_R8B);
  local_1e8.value.content.ptr = local_208.content.ptr;
  local_1e8.value.content.size_ = local_208.content.size_;
  local_1e8.value.content.disposer = local_208.content.disposer;
  local_208.content.ptr = (char *)0x0;
  local_208.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[55]> *)local_248,&local_1e8,
             &anon_var_dwarf_3b0dfe);
  sVar4 = local_1e8.value.content.size_;
  pcVar3 = local_1e8.value.content.ptr;
  if (local_1e8.value.content.ptr != (char *)0x0) {
    local_1e8.value.content.ptr = (char *)0x0;
    local_1e8.value.content.size_ = 0;
    (**(local_1e8.value.content.disposer)->_vptr_ArrayDisposer)
              (local_1e8.value.content.disposer,pcVar3,1,sVar4,sVar4,0);
    in_R8B = (undefined1)sVar4;
  }
  sVar4 = local_208.content.size_;
  pcVar3 = local_208.content.ptr;
  if (local_208.content.ptr != (char *)0x0) {
    local_208.content.ptr = (char *)0x0;
    local_208.content.size_ = 0;
    (**(local_208.content.disposer)->_vptr_ArrayDisposer)
              (local_208.content.disposer,pcVar3,1,sVar4,sVar4,0);
    in_R8B = (undefined1)sVar4;
  }
  if ((local_218 == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0x2d;
    kj::_::Debug::log<char_const(&)[243],kj::_::DebugComparison<kj::String,char_const(&)[55]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x187,ERROR,anon_var_dwarf_3b0e0b,&anon_var_dwarf_3b0e27,
               (DebugComparison<kj::String,_const_char_(&)[55]> *)local_248);
  }
  pacVar5 = (char8_t (*) [5])local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((uchar *)local_248._0_8_ != (uchar *)0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  kj::_::encodeCEscapeImpl
            (&local_208,(_ *)"foo\x01\x7fxxx",(ArrayPtr<const_unsigned_char>)ZEXT816(8),(bool)in_R8B
            );
  local_1e8.value.content.ptr = local_208.content.ptr;
  local_1e8.value.content.size_ = local_208.content.size_;
  local_1e8.value.content.disposer = local_208.content.disposer;
  local_208.content.ptr = (char *)0x0;
  local_208.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[15]> *)local_248,&local_1e8,
             (char (*) [15])"foo\\001\\177xxx");
  sVar4 = local_1e8.value.content.size_;
  pcVar3 = local_1e8.value.content.ptr;
  if (local_1e8.value.content.ptr != (char *)0x0) {
    local_1e8.value.content.ptr = (char *)0x0;
    local_1e8.value.content.size_ = 0;
    (**(local_1e8.value.content.disposer)->_vptr_ArrayDisposer)
              (local_1e8.value.content.disposer,pcVar3,1,sVar4,sVar4,0);
    in_R8B = (undefined1)sVar4;
  }
  sVar4 = local_208.content.size_;
  pcVar3 = local_208.content.ptr;
  if (local_208.content.ptr != (char *)0x0) {
    local_208.content.ptr = (char *)0x0;
    local_208.content.size_ = 0;
    (**(local_208.content.disposer)->_vptr_ArrayDisposer)
              (local_208.content.disposer,pcVar3,1,sVar4,sVar4,0);
    in_R8B = (undefined1)sVar4;
  }
  if ((local_218 == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0x9c;
    kj::_::Debug::log<char_const(&)[71],kj::_::DebugComparison<kj::String,char_const(&)[15]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x189,ERROR,
               "\"failed: expected \" \"encodeCEscape(\\\"foo\\\\x01\\\\x7fxxx\\\") == \\\"foo\\\\\\\\001\\\\\\\\177xxx\\\"\", _kjCondition"
               ,(char (*) [71])
                "failed: expected encodeCEscape(\"foo\\x01\\x7fxxx\") == \"foo\\\\001\\\\177xxx\"",
               (DebugComparison<kj::String,_const_char_(&)[15]> *)local_248);
  }
  pacVar5 = (char8_t (*) [5])local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((uchar *)local_248._0_8_ != (uchar *)0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  local_20 = 0x78787f01006f6f66;
  local_18 = 0xfffe8078;
  bytes_00.size_ = 1;
  bytes_00.ptr = (uchar *)0xc;
  kj::_::encodeCEscapeImpl(&local_208,(_ *)&local_20,bytes_00,(bool)in_R8B);
  local_1e8.value.content.ptr = local_208.content.ptr;
  local_1e8.value.content.size_ = local_208.content.size_;
  local_1e8.value.content.disposer = local_208.content.disposer;
  local_208.content.ptr = (char *)0x0;
  local_208.content.size_ = 0;
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_const_char_(&)[31]> *)local_248,&local_1e8,
             (char (*) [31])"foo\\000\\001\\177xxx\\200\\376\\377");
  sVar4 = local_1e8.value.content.size_;
  pcVar3 = local_1e8.value.content.ptr;
  if (local_1e8.value.content.ptr != (char *)0x0) {
    local_1e8.value.content.ptr = (char *)0x0;
    local_1e8.value.content.size_ = 0;
    (**(local_1e8.value.content.disposer)->_vptr_ArrayDisposer)
              (local_1e8.value.content.disposer,pcVar3,1,sVar4,sVar4,0);
    in_R8B = (undefined1)sVar4;
  }
  sVar4 = local_208.content.size_;
  pcVar3 = local_208.content.ptr;
  if (local_208.content.ptr != (char *)0x0) {
    local_208.content.ptr = (char *)0x0;
    local_208.content.size_ = 0;
    (**(local_208.content.disposer)->_vptr_ArrayDisposer)
              (local_208.content.disposer,pcVar3,1,sVar4,sVar4,0);
    in_R8B = (undefined1)sVar4;
  }
  if ((local_218 == false) && (kj::_::Debug::minSeverity < 3)) {
    in_R8B = 0x73;
    kj::_::Debug::log<char_const(&)[80],kj::_::DebugComparison<kj::String,char_const(&)[31]>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/encoding-test.c++"
               ,0x18b,ERROR,
               "\"failed: expected \" \"encodeCEscape(bytes) == \\\"foo\\\\\\\\000\\\\\\\\001\\\\\\\\177xxx\\\\\\\\200\\\\\\\\376\\\\\\\\377\\\"\", _kjCondition"
               ,(char (*) [80])
                "failed: expected encodeCEscape(bytes) == \"foo\\\\000\\\\001\\\\177xxx\\\\200\\\\376\\\\377\""
               ,(DebugComparison<kj::String,_const_char_(&)[31]> *)local_248);
  }
  pacVar5 = (char8_t (*) [5])local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((uchar *)local_248._0_8_ != (uchar *)0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text.size_ = 1;
  text.ptr = (char *)0x1b;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"fooo\\a\\b\\f\\n\\r\\t\\v\\\'\\\"\\\\bar",text,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_38 = (ArrayDisposer *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    local_248._0_8_ = (uchar *)0x0;
  }
  else {
    local_38 = (ArrayDisposer *)local_248._16_8_;
  }
  local_48 = 0;
  uStack_40 = 0;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,
             (EncodingResult<kj::String> *)"fooo\a\b\f\n\r\t\v\'\"\\bar",
             (ArrayPtr<const_char>)ZEXT816(0x11),(bool)in_R8B);
  pacVar5 = (char8_t (*) [5])local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((uchar *)local_248._0_8_ != (uchar *)0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_00.size_ = 1;
  text_00.ptr = (char *)0xe;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"foo\\x01\\x7fxxx",text_00,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_e8.super_String.content.ptr = (char *)0x0;
    local_e8.super_String.content.size_ = 0;
    local_e8.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_e8.super_String.content.ptr = (char *)local_248._0_8_;
    local_e8.super_String.content.size_ = local_248._8_8_;
    local_e8.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  local_e8.hadErrors = local_248[0x18];
  (anonymous_namespace)::expectRes<kj::String,char,9ul>
            (&local_e8,(char (*) [9])"foo\x01\x7fxxx",false);
  pacVar5 = (char8_t (*) [5])local_e8.super_String.content.size_;
  pcVar3 = local_e8.super_String.content.ptr;
  if ((uchar *)local_e8.super_String.content.ptr != (uchar *)0x0) {
    local_e8.super_String.content.ptr = (char *)0x0;
    local_e8.super_String.content.size_ = 0;
    (**(local_e8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_e8.super_String.content.disposer,pcVar3,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_01.size_ = 1;
  text_01.ptr = (char *)0xe;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"foo\\001\\177234",text_01,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_108.super_String.content.ptr = (char *)0x0;
    local_108.super_String.content.size_ = 0;
    local_108.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_108.super_String.content.ptr = (char *)local_248._0_8_;
    local_108.super_String.content.size_ = local_248._8_8_;
    local_108.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  local_108.hadErrors = local_248[0x18];
  (anonymous_namespace)::expectRes<kj::String,char,9ul>
            (&local_108,(char (*) [9])"foo\x01\x7f234",false);
  pacVar5 = (char8_t (*) [5])local_108.super_String.content.size_;
  pcVar3 = local_108.super_String.content.ptr;
  if ((uchar *)local_108.super_String.content.ptr != (uchar *)0x0) {
    local_108.super_String.content.ptr = (char *)0x0;
    local_108.super_String.content.size_ = 0;
    (**(local_108.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_108.super_String.content.disposer,pcVar3,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_02.size_ = 1;
  text_02.ptr = &DAT_00000006;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\x1",text_02
                      ,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_128.super_String.content.ptr = (char *)0x0;
    local_128.super_String.content.size_ = 0;
    local_128.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_128.super_String.content.ptr = (char *)local_248._0_8_;
    local_128.super_String.content.size_ = local_248._8_8_;
    local_128.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  local_128.hadErrors = local_248[0x18];
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_128,(char (*) [5])"foo\x01",false);
  pacVar5 = (char8_t (*) [5])local_128.super_String.content.size_;
  pcVar3 = local_128.super_String.content.ptr;
  if ((uchar *)local_128.super_String.content.ptr != (uchar *)0x0) {
    local_128.super_String.content.ptr = (char *)0x0;
    local_128.super_String.content.size_ = 0;
    (**(local_128.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_128.super_String.content.disposer,pcVar3,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_03.size_ = 1;
  text_03.ptr = &DAT_00000005;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\1",text_03,
                      (bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_148.super_String.content.ptr = (char *)0x0;
    local_148.super_String.content.size_ = 0;
    local_148.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_148.super_String.content.ptr = (char *)local_248._0_8_;
    local_148.super_String.content.size_ = local_248._8_8_;
    local_148.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  local_148.hadErrors = local_248[0x18];
  (anonymous_namespace)::expectRes<kj::String,char,5ul>(&local_148,(char (*) [5])"foo\x01",false);
  pacVar5 = (char8_t (*) [5])local_148.super_String.content.size_;
  pcVar3 = local_148.super_String.content.ptr;
  if ((uchar *)local_148.super_String.content.ptr != (uchar *)0x0) {
    local_148.super_String.content.ptr = (char *)0x0;
    local_148.super_String.content.size_ = 0;
    (**(local_148.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_148.super_String.content.disposer,pcVar3,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_04.size_ = 1;
  text_04.ptr = (char *)0xc;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\u1234bar",
                      text_04,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_58 = (ArrayDisposer *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    local_248._0_8_ = (uchar *)0x0;
  }
  else {
    local_58 = (ArrayDisposer *)local_248._16_8_;
  }
  local_68 = 0;
  uStack_60 = 0;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,(EncodingResult<kj::String> *)anon_var_dwarf_3b0f3d,
             (ArrayPtr<const_char>)ZEXT816(9),(bool)in_R8B);
  pacVar5 = (char8_t (*) [5])local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((uchar *)local_248._0_8_ != (uchar *)0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_05.size_ = 1;
  text_05.ptr = (char *)0x10;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"foo\\U00045678bar",text_05,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_78 = (ArrayDisposer *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    local_248._0_8_ = (uchar *)0x0;
  }
  else {
    local_78 = (ArrayDisposer *)local_248._16_8_;
  }
  local_88 = 0;
  uStack_80 = 0;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,(EncodingResult<kj::String> *)anon_var_dwarf_3b0f65,
             (ArrayPtr<const_char>)ZEXT816(10),(bool)in_R8B);
  pacVar5 = (char8_t (*) [5])local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((uchar *)local_248._0_8_ != (uchar *)0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  pcVar3 = "foo\\";
  text_06.size_ = 1;
  text_06.ptr = &DAT_00000004;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\",text_06,
                      (bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_168.super_String.content.ptr = (char *)0x0;
    local_168.super_String.content.size_ = 0;
    local_168.super_String.content.disposer = (ArrayDisposer *)0x0;
    puVar2 = extraout_RDX;
  }
  else {
    local_168.super_String.content.ptr = (char *)local_248._0_8_;
    local_168.super_String.content.size_ = local_248._8_8_;
    local_168.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
    puVar2 = (uchar *)local_248._0_8_;
    pcVar3 = (char *)local_248._8_8_;
  }
  local_168.hadErrors = local_248[0x18];
  (anonymous_namespace)::expectRes<kj::String,char,4ul>
            (&local_168,(char (*) [4])pcVar3,SUB81(puVar2,0));
  pacVar5 = (char8_t (*) [5])local_168.super_String.content.size_;
  pcVar3 = local_168.super_String.content.ptr;
  if ((uchar *)local_168.super_String.content.ptr != (uchar *)0x0) {
    local_168.super_String.content.ptr = (char *)0x0;
    local_168.super_String.content.size_ = 0;
    (**(local_168.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_168.super_String.content.disposer,pcVar3,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_07.size_ = 1;
  text_07.ptr = (char *)0x9;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\x123x",
                      text_07,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_98 = (ArrayDisposer *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    local_248._0_8_ = (uchar *)0x0;
  }
  else {
    local_98 = (ArrayDisposer *)local_248._16_8_;
  }
  local_a8 = 0;
  uStack_a0 = 0;
  expected.size_ = 1;
  expected.ptr = &DAT_00000005;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,(EncodingResult<kj::String> *)"foo#x",expected,
             (bool)in_R8B);
  pacVar5 = (char8_t (*) [5])local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((uchar *)local_248._0_8_ != (uchar *)0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  pcVar3 = "foo\\u12";
  text_08.size_ = 1;
  text_08.ptr = (char *)0x7;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\u12",
                      text_08,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_188.super_String.content.ptr = (char *)0x0;
    local_188.super_String.content.size_ = 0;
    local_188.super_String.content.disposer = (ArrayDisposer *)0x0;
    puVar2 = extraout_RDX_00;
  }
  else {
    local_188.super_String.content.ptr = (char *)local_248._0_8_;
    local_188.super_String.content.size_ = local_248._8_8_;
    local_188.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
    puVar2 = (uchar *)local_248._0_8_;
    pcVar3 = (char *)local_248._8_8_;
  }
  local_188.hadErrors = local_248[0x18];
  (anonymous_namespace)::expectRes<kj::String,5ul>
            (&local_188,(char8_t (*) [5])pcVar3,SUB81(puVar2,0));
  pacVar5 = (char8_t (*) [5])local_188.super_String.content.size_;
  pcVar3 = local_188.super_String.content.ptr;
  if ((uchar *)local_188.super_String.content.ptr != (uchar *)0x0) {
    local_188.super_String.content.ptr = (char *)0x0;
    local_188.super_String.content.size_ = 0;
    (**(local_188.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_188.super_String.content.disposer,pcVar3,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_09.size_ = 1;
  text_09.ptr = (char *)0xa;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\u12xxx",
                      text_09,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_b8 = (ArrayDisposer *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    local_248._0_8_ = (uchar *)0x0;
  }
  else {
    local_b8 = (ArrayDisposer *)local_248._16_8_;
  }
  local_c8 = 0;
  uStack_c0 = 0;
  expected_00.size_ = 1;
  expected_00.ptr = (char *)0x7;
  (anonymous_namespace)::expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)local_248,(EncodingResult<kj::String> *)"foo\x12xxx",
             expected_00,(bool)in_R8B);
  pacVar5 = (char8_t (*) [5])local_248._8_8_;
  uVar1 = local_248._0_8_;
  if ((uchar *)local_248._0_8_ != (uchar *)0x0) {
    local_248._0_8_ = (uchar *)0x0;
    local_248._8_8_ = (char8_t (*) [5])0x0;
    (***(_func_int ***)local_248._16_8_)(local_248._16_8_,uVar1,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  pcVar3 = "foo\\U12";
  text_10.size_ = 1;
  text_10.ptr = (char *)0x7;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,(kj *)"foo\\U12",
                      text_10,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_1a8.super_String.content.ptr = (char *)0x0;
    local_1a8.super_String.content.size_ = 0;
    local_1a8.super_String.content.disposer = (ArrayDisposer *)0x0;
    puVar2 = extraout_RDX_01;
  }
  else {
    local_1a8.super_String.content.ptr = (char *)local_248._0_8_;
    local_1a8.super_String.content.size_ = local_248._8_8_;
    local_1a8.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
    puVar2 = (uchar *)local_248._0_8_;
    pcVar3 = (char *)local_248._8_8_;
  }
  local_1a8.hadErrors = local_248[0x18];
  (anonymous_namespace)::expectRes<kj::String,5ul>
            (&local_1a8,(char8_t (*) [5])pcVar3,SUB81(puVar2,0));
  pacVar5 = (char8_t (*) [5])local_1a8.super_String.content.size_;
  pcVar3 = local_1a8.super_String.content.ptr;
  if ((uchar *)local_1a8.super_String.content.ptr != (uchar *)0x0) {
    local_1a8.super_String.content.ptr = (char *)0x0;
    local_1a8.super_String.content.size_ = 0;
    (**(local_1a8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_1a8.super_String.content.disposer,pcVar3,1,pacVar5,pacVar5,0);
    in_R8B = SUB81(pacVar5,0);
  }
  text_11.size_ = 1;
  text_11.ptr = (char *)0xf;
  decodeBinaryCEscape((EncodingResult<kj::Array<unsigned_char>_> *)local_248,
                      (kj *)"foo\\U12xxxxxxxx",text_11,(bool)in_R8B);
  if ((ArrayDisposer *)local_248._16_8_ == (ArrayDisposer *)0x0) {
    local_1c8.super_String.content.ptr = (char *)0x0;
    local_1c8.super_String.content.size_ = 0;
    local_1c8.super_String.content.disposer = (ArrayDisposer *)0x0;
  }
  else {
    local_1c8.super_String.content.ptr = (char *)local_248._0_8_;
    local_1c8.super_String.content.size_ = local_248._8_8_;
    local_1c8.super_String.content.disposer = (ArrayDisposer *)local_248._16_8_;
  }
  local_1c8.hadErrors = local_248[0x18];
  (anonymous_namespace)::expectRes<kj::String,13ul>
            (&local_1c8,(char8_t (*) [13])"foo\x12xxxxxxxx",true);
  sVar4 = local_1c8.super_String.content.size_;
  pcVar3 = local_1c8.super_String.content.ptr;
  if ((uchar *)local_1c8.super_String.content.ptr != (uchar *)0x0) {
    local_1c8.super_String.content.ptr = (char *)0x0;
    local_1c8.super_String.content.size_ = 0;
    (**(local_1c8.super_String.content.disposer)->_vptr_ArrayDisposer)
              (local_1c8.super_String.content.disposer,pcVar3,1,sVar4,sVar4,0);
  }
  return;
}

Assistant:

TEST(Async, SeparateFulfillerChained) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<Promise<int>>();
  auto inner = newPromiseAndFulfiller<int>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill(kj::mv(inner.promise));
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  inner.fulfiller->fulfill(123);

  EXPECT_EQ(123, pair.promise.wait(waitScope));
}